

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O0

size_t mbedtls_mpi_core_bitlen(mbedtls_mpi_uint *A,size_t A_limbs)

{
  size_t sVar1;
  size_t j;
  int i;
  size_t A_limbs_local;
  mbedtls_mpi_uint *A_local;
  
  j._4_4_ = (int)A_limbs;
  do {
    j._4_4_ = j._4_4_ + -1;
    if (j._4_4_ < 0) {
      return 0;
    }
  } while (A[j._4_4_] == 0);
  sVar1 = mbedtls_mpi_core_clz(A[j._4_4_]);
  return (long)j._4_4_ * 0x40 + (0x40 - sVar1);
}

Assistant:

size_t mbedtls_mpi_core_bitlen(const mbedtls_mpi_uint *A, size_t A_limbs)
{
    int i;
    size_t j;

    for (i = ((int) A_limbs) - 1; i >= 0; i--) {
        if (A[i] != 0) {
            j = biL - mbedtls_mpi_core_clz(A[i]);
            return (i * biL) + j;
        }
    }

    return 0;
}